

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O2

void copy_suite::run(void)

{
  expand_copy();
  expand_copy_if();
  expand_copy_n();
  back_inserter_copy();
  back_inserter_copy_if();
  back_inserter_copy_n();
  partition_copy();
  remove_copy();
  reverse_copy();
  rotate_copy();
  unique_copy();
  return;
}

Assistant:

void run()
{
    expand_copy();
    expand_copy_if();
    expand_copy_n();
    back_inserter_copy();
    back_inserter_copy_if();
    back_inserter_copy_n();
    partition_copy();
    remove_copy();
    reverse_copy();
    rotate_copy();
    unique_copy();
}